

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-conversions.cc
# Opt level: O0

double StrToD16(char *str,int flags,double empty_string_value,int *processed_characters_count,
               bool *processed_all,char char_separator,uc16 separator)

{
  StringToDoubleConverter *in_RCX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  uc16 in_R9W;
  double in_XMM0_Qa;
  double dVar1;
  double result;
  StringToDoubleConverter converter;
  int i;
  int length;
  uc16 str16 [256];
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd68;
  StringToDoubleConverter local_270;
  int local_240;
  int local_23c;
  uc16 local_238 [262];
  uc16 local_2c;
  char local_29;
  StringToDoubleConverter *local_28;
  int *local_20;
  double local_18;
  int local_c;
  long local_8;
  
  local_29 = (char)in_R8D;
  local_240 = 0;
  local_2c = in_R9W;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  local_8 = in_RDI;
  while( true ) {
    if (*(char *)(local_8 + local_240) == local_29) {
      local_238[local_240] = local_2c;
    }
    else {
      local_238[local_240] = (short)*(char *)(local_8 + local_240);
    }
    if (*(char *)(local_8 + local_240) == '\0') break;
    local_240 = local_240 + 1;
  }
  local_23c = local_240;
  dVar1 = double_conversion::Double::NaN();
  double_conversion::StringToDoubleConverter::StringToDoubleConverter
            (&local_270,local_c,local_18,dVar1,(char *)0x0,(char *)0x0,local_2c);
  dVar1 = double_conversion::StringToDoubleConverter::StringToDouble
                    (in_RCX,(uc16 *)CONCAT44(in_R8D,in_stack_fffffffffffffd68),
                     (int)((ulong)local_18 >> 0x20),
                     (int *)CONCAT44(local_c,in_stack_fffffffffffffd58));
  *(bool *)&local_28->flags_ = local_23c == *local_20;
  return dVar1;
}

Assistant:

static double StrToD16(const char* str, int flags,
                       double empty_string_value,
                       int* processed_characters_count, bool* processed_all,
                       char char_separator, uc16 separator) {
  uc16 str16[256];
  int length = -1;
  for (int i = 0;; i++) {
    if (str[i] == char_separator) {
            str16[i] = separator;
    } else {
            str16[i] = str[i];
    }
    if (str[i] == '\0') {
      length = i;
      break;
    }
  }
  DOUBLE_CONVERSION_ASSERT(length < 256);
  StringToDoubleConverter converter(flags, empty_string_value, Double::NaN(),
                                    NULL, NULL, separator);
  double result =
      converter.StringToDouble(str16, length, processed_characters_count);
  *processed_all = (length == *processed_characters_count);
  return result;
}